

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O0

bool __thiscall flow::util::IPAddress::set(IPAddress *this,string *text,Family family)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int rv;
  Family family_local;
  string *text_local;
  IPAddress *this_local;
  
  this->family_ = family;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = inet_pton(family,pcVar2,this->buf_);
  __stream = _stderr;
  if (iVar1 < 1) {
    if (iVar1 < 0) {
      perror("inet_pton");
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"IP address Not in presentation format: %s\n",uVar3);
    }
    this->cstr_[0] = '\0';
    this_local._7_1_ = false;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strncpy(this->cstr_,pcVar2,0x2e);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool IPAddress::set(const std::string& text, Family family) {
  family_ = family;
  int rv = inet_pton(static_cast<int>(family), text.c_str(), buf_);
  if (rv <= 0) {
    if (rv < 0)
      perror("inet_pton");
    else
      fprintf(stderr, "IP address Not in presentation format: %s\n",
              text.c_str());

    cstr_[0] = 0;
    return false;
  }

#if defined(_WIN32) || defined(_WIN64)
  strncpy_s(cstr_, sizeof(cstr_), text.c_str(), text.size());
#else
  strncpy(cstr_, text.c_str(), sizeof(cstr_));
#endif

  return true;
}